

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O0

TIFFReadDirEntryErr TIFFReadDirEntryDoubleArray(TIFF *tif,TIFFDirEntry *direntry,double **value)

{
  double dVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  double *pdVar5;
  uint32_t *puVar6;
  undefined1 auVar7 [16];
  uint local_154;
  double *pdStack_150;
  uint32_t n_10;
  double *mb_10;
  float *ma_10;
  double *pdStack_138;
  uint32_t n_9;
  double *mb_9;
  uint32_t mab_1;
  int32_t maa_1;
  uint32_t *ma_9;
  double *pdStack_118;
  uint32_t n_8;
  double *mb_8;
  uint32_t mab;
  uint32_t maa;
  uint32_t *ma_8;
  double *pdStack_f8;
  uint32_t n_7;
  double *mb_7;
  int64_t *ma_7;
  double *pdStack_e0;
  uint32_t n_6;
  double *mb_6;
  uint64_t *ma_6;
  double *pdStack_c8;
  uint32_t n_5;
  double *mb_5;
  int32_t *ma_5;
  double *pdStack_b0;
  uint32_t n_4;
  double *mb_4;
  uint32_t *ma_4;
  double *pdStack_98;
  uint32_t n_3;
  double *mb_3;
  int16_t *ma_3;
  double *pdStack_80;
  uint32_t n_2;
  double *mb_2;
  uint16_t *ma_2;
  double *pdStack_68;
  uint32_t n_1;
  double *mb_1;
  int8_t *ma_1;
  double *pdStack_50;
  uint32_t n;
  double *mb;
  uint8_t *ma;
  double *data;
  void *origdata;
  uint32_t count;
  TIFFReadDirEntryErr err;
  double **value_local;
  TIFFDirEntry *direntry_local;
  TIFF *tif_local;
  
  uVar4 = (uint)direntry->tdir_type;
  if ((((uVar4 == 1) || (uVar4 - 3 < 4)) || (uVar4 - 8 < 5)) || (uVar4 == 0x10 || uVar4 == 0x11)) {
    _count = value;
    value_local = (double **)direntry;
    direntry_local = (TIFFDirEntry *)tif;
    origdata._4_4_ = TIFFReadDirEntryArray(tif,direntry,(uint32_t *)&origdata,8,&data);
    if ((origdata._4_4_ == TIFFReadDirEntryErrOk) && (data != (double *)0x0)) {
      if (*(short *)((long)value_local + 2) == 0xc) {
        if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
          TIFFSwabArrayOfLong8((uint64_t *)data,(ulong)(uint)origdata);
        }
        *_count = data;
        tif_local._4_4_ = TIFFReadDirEntryErrOk;
      }
      else {
        pdVar5 = (double *)_TIFFmallocExt((TIFF *)direntry_local,(ulong)(uint)origdata << 3);
        if (pdVar5 == (double *)0x0) {
          _TIFFfreeExt((TIFF *)direntry_local,data);
          tif_local._4_4_ = TIFFReadDirEntryErrAlloc;
        }
        else {
          switch(*(undefined2 *)((long)value_local + 2)) {
          case 1:
            mb = data;
            pdStack_50 = pdVar5;
            for (ma_1._4_4_ = 0; ma_1._4_4_ < (uint)origdata; ma_1._4_4_ = ma_1._4_4_ + 1) {
              *pdStack_50 = (double)*(byte *)mb;
              pdStack_50 = pdStack_50 + 1;
              mb = (double *)((long)mb + 1);
            }
            break;
          case 3:
            mb_2 = data;
            pdStack_80 = pdVar5;
            for (ma_3._4_4_ = 0; ma_3._4_4_ < (uint)origdata; ma_3._4_4_ = ma_3._4_4_ + 1) {
              if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
                TIFFSwabShort((uint16_t *)mb_2);
              }
              *pdStack_80 = (double)*(ushort *)mb_2;
              pdStack_80 = pdStack_80 + 1;
              mb_2 = (double *)((long)mb_2 + 2);
            }
            break;
          case 4:
            mb_4 = data;
            pdStack_b0 = pdVar5;
            for (ma_5._4_4_ = 0; ma_5._4_4_ < (uint)origdata; ma_5._4_4_ = ma_5._4_4_ + 1) {
              if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
                TIFFSwabLong((uint32_t *)mb_4);
              }
              *pdStack_b0 = (double)*(uint *)mb_4;
              pdStack_b0 = pdStack_b0 + 1;
              mb_4 = (double *)((long)mb_4 + 4);
            }
            break;
          case 5:
            _mab = data;
            pdStack_118 = pdVar5;
            for (ma_9._4_4_ = 0; ma_9._4_4_ < (uint)origdata; ma_9._4_4_ = ma_9._4_4_ + 1) {
              if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
                TIFFSwabLong((uint32_t *)_mab);
              }
              puVar6 = (uint32_t *)((long)_mab + 4);
              uVar4 = *(uint *)_mab;
              if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
                TIFFSwabLong(puVar6);
              }
              _mab = _mab + 1;
              uVar2 = *puVar6;
              if (uVar2 == 0) {
                *pdStack_118 = 0.0;
              }
              else {
                *pdStack_118 = (double)uVar4 / (double)uVar2;
              }
              pdStack_118 = pdStack_118 + 1;
            }
            break;
          case 6:
            mb_1 = data;
            pdStack_68 = pdVar5;
            for (ma_2._4_4_ = 0; ma_2._4_4_ < (uint)origdata; ma_2._4_4_ = ma_2._4_4_ + 1) {
              *pdStack_68 = (double)(int)*(char *)mb_1;
              pdStack_68 = pdStack_68 + 1;
              mb_1 = (double *)((long)mb_1 + 1);
            }
            break;
          case 8:
            mb_3 = data;
            pdStack_98 = pdVar5;
            for (ma_4._4_4_ = 0; ma_4._4_4_ < (uint)origdata; ma_4._4_4_ = ma_4._4_4_ + 1) {
              if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
                TIFFSwabShort((uint16_t *)mb_3);
              }
              *pdStack_98 = (double)(int)*(short *)mb_3;
              pdStack_98 = pdStack_98 + 1;
              mb_3 = (double *)((long)mb_3 + 2);
            }
            break;
          case 9:
            mb_5 = data;
            pdStack_c8 = pdVar5;
            for (ma_6._4_4_ = 0; ma_6._4_4_ < (uint)origdata; ma_6._4_4_ = ma_6._4_4_ + 1) {
              if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
                TIFFSwabLong((uint32_t *)mb_5);
              }
              *pdStack_c8 = (double)*(int *)mb_5;
              pdStack_c8 = pdStack_c8 + 1;
              mb_5 = (double *)((long)mb_5 + 4);
            }
            break;
          case 10:
            _mab_1 = data;
            pdStack_138 = pdVar5;
            for (ma_10._4_4_ = 0; ma_10._4_4_ < (uint)origdata; ma_10._4_4_ = ma_10._4_4_ + 1) {
              if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
                TIFFSwabLong((uint32_t *)_mab_1);
              }
              uVar3 = *(uint32_t *)_mab_1;
              puVar6 = (uint32_t *)((long)_mab_1 + 4);
              if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
                TIFFSwabLong(puVar6);
              }
              _mab_1 = _mab_1 + 1;
              uVar4 = *puVar6;
              if (uVar4 == 0) {
                *pdStack_138 = 0.0;
              }
              else {
                *pdStack_138 = (double)(int)uVar3 / (double)uVar4;
              }
              pdStack_138 = pdStack_138 + 1;
            }
            break;
          case 0xb:
            if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
              TIFFSwabArrayOfLong((uint32_t *)data,(ulong)(uint)origdata);
            }
            mb_10 = data;
            pdStack_150 = pdVar5;
            for (local_154 = 0; local_154 < (uint)origdata; local_154 = local_154 + 1) {
              *pdStack_150 = (double)*(float *)mb_10;
              pdStack_150 = pdStack_150 + 1;
              mb_10 = (double *)((long)mb_10 + 4);
            }
            break;
          case 0x10:
            mb_6 = data;
            pdStack_e0 = pdVar5;
            for (ma_7._4_4_ = 0; ma_7._4_4_ < (uint)origdata; ma_7._4_4_ = ma_7._4_4_ + 1) {
              if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
                TIFFSwabLong8((uint64_t *)mb_6);
              }
              dVar1 = *mb_6;
              auVar7._8_4_ = (int)((ulong)dVar1 >> 0x20);
              auVar7._0_8_ = dVar1;
              auVar7._12_4_ = 0x45300000;
              *pdStack_e0 = (auVar7._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,SUB84(dVar1,0)) - 4503599627370496.0);
              pdStack_e0 = pdStack_e0 + 1;
              mb_6 = mb_6 + 1;
            }
            break;
          case 0x11:
            mb_7 = data;
            pdStack_f8 = pdVar5;
            for (ma_8._4_4_ = 0; ma_8._4_4_ < (uint)origdata; ma_8._4_4_ = ma_8._4_4_ + 1) {
              if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
                TIFFSwabLong8((uint64_t *)mb_7);
              }
              *pdStack_f8 = (double)(long)*mb_7;
              pdStack_f8 = pdStack_f8 + 1;
              mb_7 = mb_7 + 1;
            }
          }
          _TIFFfreeExt((TIFF *)direntry_local,data);
          *_count = pdVar5;
          tif_local._4_4_ = TIFFReadDirEntryErrOk;
        }
      }
    }
    else {
      *_count = (double *)0x0;
      tif_local._4_4_ = origdata._4_4_;
    }
  }
  else {
    tif_local._4_4_ = TIFFReadDirEntryErrType;
  }
  return tif_local._4_4_;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntryDoubleArray(TIFF *tif, TIFFDirEntry *direntry, double **value)
{
    enum TIFFReadDirEntryErr err;
    uint32_t count;
    void *origdata;
    double *data;
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        case TIFF_SBYTE:
        case TIFF_SHORT:
        case TIFF_SSHORT:
        case TIFF_LONG:
        case TIFF_SLONG:
        case TIFF_LONG8:
        case TIFF_SLONG8:
        case TIFF_RATIONAL:
        case TIFF_SRATIONAL:
        case TIFF_FLOAT:
        case TIFF_DOUBLE:
            break;
        default:
            return (TIFFReadDirEntryErrType);
    }
    err = TIFFReadDirEntryArray(tif, direntry, &count, 8, &origdata);
    if ((err != TIFFReadDirEntryErrOk) || (origdata == 0))
    {
        *value = 0;
        return (err);
    }
    switch (direntry->tdir_type)
    {
        case TIFF_DOUBLE:
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabArrayOfLong8((uint64_t *)origdata, count);
            TIFFCvtIEEEDoubleToNative(tif, count, (double *)origdata);
            *value = (double *)origdata;
            return (TIFFReadDirEntryErrOk);
    }
    data = (double *)_TIFFmallocExt(tif, count * sizeof(double));
    if (data == 0)
    {
        _TIFFfreeExt(tif, origdata);
        return (TIFFReadDirEntryErrAlloc);
    }
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        {
            uint8_t *ma;
            double *mb;
            uint32_t n;
            ma = (uint8_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
                *mb++ = (double)(*ma++);
        }
        break;
        case TIFF_SBYTE:
        {
            int8_t *ma;
            double *mb;
            uint32_t n;
            ma = (int8_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
                *mb++ = (double)(*ma++);
        }
        break;
        case TIFF_SHORT:
        {
            uint16_t *ma;
            double *mb;
            uint32_t n;
            ma = (uint16_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabShort(ma);
                *mb++ = (double)(*ma++);
            }
        }
        break;
        case TIFF_SSHORT:
        {
            int16_t *ma;
            double *mb;
            uint32_t n;
            ma = (int16_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabShort((uint16_t *)ma);
                *mb++ = (double)(*ma++);
            }
        }
        break;
        case TIFF_LONG:
        {
            uint32_t *ma;
            double *mb;
            uint32_t n;
            ma = (uint32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                *mb++ = (double)(*ma++);
            }
        }
        break;
        case TIFF_SLONG:
        {
            int32_t *ma;
            double *mb;
            uint32_t n;
            ma = (int32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong((uint32_t *)ma);
                *mb++ = (double)(*ma++);
            }
        }
        break;
        case TIFF_LONG8:
        {
            uint64_t *ma;
            double *mb;
            uint32_t n;
            ma = (uint64_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8(ma);
#if defined(__WIN32__) && (_MSC_VER < 1500)
                /*
                 * XXX: MSVC 6.0 does not support
                 * conversion of 64-bit integers into
                 * floating point values.
                 */
                *mb++ = _TIFFUInt64ToDouble(*ma++);
#else
                *mb++ = (double)(*ma++);
#endif
            }
        }
        break;
        case TIFF_SLONG8:
        {
            int64_t *ma;
            double *mb;
            uint32_t n;
            ma = (int64_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong8((uint64_t *)ma);
                *mb++ = (double)(*ma++);
            }
        }
        break;
        case TIFF_RATIONAL:
        {
            uint32_t *ma;
            uint32_t maa;
            uint32_t mab;
            double *mb;
            uint32_t n;
            ma = (uint32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                maa = *ma++;
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                mab = *ma++;
                if (mab == 0)
                    *mb++ = 0.0;
                else
                    *mb++ = (double)maa / (double)mab;
            }
        }
        break;
        case TIFF_SRATIONAL:
        {
            uint32_t *ma;
            int32_t maa;
            uint32_t mab;
            double *mb;
            uint32_t n;
            ma = (uint32_t *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
            {
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                maa = *(int32_t *)ma;
                ma++;
                if (tif->tif_flags & TIFF_SWAB)
                    TIFFSwabLong(ma);
                mab = *ma++;
                if (mab == 0)
                    *mb++ = 0.0;
                else
                    *mb++ = (double)maa / (double)mab;
            }
        }
        break;
        case TIFF_FLOAT:
        {
            float *ma;
            double *mb;
            uint32_t n;
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabArrayOfLong((uint32_t *)origdata, count);
            TIFFCvtIEEEFloatToNative(tif, count, (float *)origdata);
            ma = (float *)origdata;
            mb = data;
            for (n = 0; n < count; n++)
                *mb++ = (double)(*ma++);
        }
        break;
    }
    _TIFFfreeExt(tif, origdata);
    *value = data;
    return (TIFFReadDirEntryErrOk);
}